

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::status(torrent *this,torrent_status *st,status_flags_t flags)

{
  info_hash_t *this_00;
  int iVar1;
  peer_list *ppVar2;
  element_type *peVar3;
  announce_endpoint *paVar4;
  _Head_base<0UL,_unsigned_int_*,_false> _Var5;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_01;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  error_category *peVar11;
  time_t tVar12;
  int64_t iVar13;
  undefined3 uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  time_point32 tVar18;
  int iVar19;
  seconds32 sVar20;
  size_type sVar21;
  undefined4 extraout_var;
  long lVar22;
  torrent_flags_t tVar23;
  header_holder_type *phVar24;
  pair<int,_int> pVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  piece_index_t index;
  __normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  _Var29;
  __normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  __it;
  node_ptr plVar30;
  float fVar31;
  char local_84;
  undefined1 local_50 [32];
  
  tVar18 = time_now32();
  get_handle((torrent *)local_50);
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)st,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_50);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  this_00 = &this->m_info_hash;
  (st->info_hashes).v2.m_number._M_elems[7] = (this->m_info_hash).v2.m_number._M_elems[7];
  uVar6 = *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems;
  uVar7 = *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2);
  uVar8 = *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4);
  uVar9 = *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1);
  uVar10 = *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5);
  *(undefined8 *)((st->info_hashes).v2.m_number._M_elems + 3) =
       *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3);
  *(undefined8 *)((st->info_hashes).v2.m_number._M_elems + 5) = uVar10;
  *(undefined8 *)((st->info_hashes).v1.m_number._M_elems + 4) = uVar8;
  *(undefined8 *)((st->info_hashes).v2.m_number._M_elems + 1) = uVar9;
  *(undefined8 *)(st->info_hashes).v1.m_number._M_elems = uVar6;
  *(undefined8 *)((st->info_hashes).v1.m_number._M_elems + 2) = uVar7;
  info_hash_t::get_best((sha1_hash *)local_50,this_00);
  (st->info_hash).m_number._M_elems[4] = local_50._16_4_;
  *(ulong *)(st->info_hash).m_number._M_elems = CONCAT62(local_50._2_6_,local_50._0_2_);
  *(undefined8 *)((st->info_hash).m_number._M_elems + 2) = local_50._8_8_;
  if ((flags.m_val & 0x40) != 0) {
    name_abi_cxx11_((string *)local_50,this);
    ::std::__cxx11::string::operator=((string *)&st->name,(string *)local_50);
    ::std::__cxx11::string::~string((string *)local_50);
  }
  local_84 = (char)flags.m_val;
  if (local_84 < '\0') {
    ::std::__cxx11::string::string((string *)local_50,(string *)&this->m_save_path);
    ::std::__cxx11::string::operator=((string *)&st->save_path,(string *)local_50);
    ::std::__cxx11::string::~string((string *)local_50);
  }
  if ((flags.m_val & 0x20) != 0) {
    ::std::__weak_ptr<libtorrent::torrent_info_const,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<libtorrent::torrent_info_const,(__gnu_cxx::_Lock_policy)2> *)
               &st->torrent_file,
               &(this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>);
  }
  st->has_incoming = (bool)((byte)this->field_0x5c0 >> 2 & 1);
  bVar15 = (this->m_error).failed_;
  uVar14 = *(undefined3 *)&(this->m_error).field_0x5;
  peVar11 = (this->m_error).cat_;
  (st->errc).val_ = (this->m_error).val_;
  (st->errc).failed_ = bVar15;
  *(undefined3 *)&(st->errc).field_0x5 = uVar14;
  (st->errc).cat_ = peVar11;
  (st->error_file).m_val = (this->m_error_file).m_val;
  st->moving_storage = (bool)((byte)this->field_0x600 >> 5 & 1);
  st->announcing_to_trackers = (bool)(this->field_0x5c0 & 1);
  st->announcing_to_lsd = (bool)((byte)this->field_0x5c0 >> 1 & 1);
  st->announcing_to_dht = (bool)(this->field_0x5e0 & 1);
  tVar12 = this->m_completed_time;
  st->added_time = this->m_added_time;
  st->completed_time = tVar12;
  st->up_bandwidth_queue = 0;
  st->down_bandwidth_queue = 0;
  iVar19 = num_peers(this);
  st->num_peers = iVar19 - (uint)this->m_num_connecting;
  ppVar2 = (this->super_torrent_hot_members).m_peer_list._M_t.
           super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
           .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
  if (ppVar2 == (peer_list *)0x0) {
    st->list_peers = 0;
LAB_002e70f8:
    st->list_seeds = 0;
    iVar19 = 0;
  }
  else {
    sVar21 = ::std::
             deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     *)ppVar2);
    ppVar2 = (this->super_torrent_hot_members).m_peer_list._M_t.
             super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
             .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
    st->list_peers = (int)sVar21;
    if (ppVar2 == (peer_list *)0x0) goto LAB_002e70f8;
    st->list_seeds = *(uint *)&ppVar2->field_0x60 & 0x7fffffff;
    iVar19 = ppVar2->m_num_connect_candidates;
  }
  st->connect_candidates = iVar19;
  iVar19 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  iVar19 = seed_rank(this,(session_settings *)CONCAT44(extraout_var,iVar19));
  st->seed_rank = iVar19;
  iVar13 = this->m_total_downloaded;
  st->all_time_upload = this->m_total_uploaded;
  st->all_time_download = iVar13;
  sVar20 = finished_time(this);
  (st->finished_duration).__r = (long)sVar20.__r;
  sVar20 = active_time(this);
  (st->active_duration).__r = (long)sVar20.__r;
  sVar20 = seeding_time(this);
  (st->seeding_duration).__r = (long)sVar20.__r;
  (st->last_upload).__d.__r = (long)(this->m_last_upload).__d.__r * 1000000000;
  (st->last_download).__d.__r = (long)(this->m_last_download).__d.__r * 1000000000;
  st->storage_mode = *(uint *)&this->field_0x5c0 >> 4 & 3;
  uVar26 = *(uint *)&(this->super_torrent_hot_members).field_0x48 & 0xffffff;
  if (uVar26 == 0xffffff) {
    uVar26 = 0xffffffff;
  }
  st->num_complete = uVar26;
  uVar26 = *(uint *)&this->field_0x5dd & 0xffffff;
  if (uVar26 == 0xffffff) {
    uVar26 = 0xffffffff;
  }
  st->num_incomplete = uVar26;
  bVar15 = is_seed(this);
  st->is_seeding = bVar15;
  bVar15 = is_finished(this);
  st->is_finished = bVar15;
  st->has_metadata =
       0 < (((this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_files).m_piece_length;
  bytes_done(this,st,flags);
  lVar22 = *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                     field_0x20;
  st->total_payload_download = lVar22;
  lVar27 = *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>;
  st->total_payload_upload = lVar27;
  st->total_download =
       lVar22 + *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                          field_0x30;
  st->total_upload =
       lVar27 + *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                          field_0x10;
  iVar13 = this->m_total_redundant_bytes;
  st->total_failed_bytes = this->m_total_failed_bytes;
  st->total_redundant_bytes = iVar13;
  iVar19 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x2c
  ;
  st->download_rate =
       *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x3c +
       iVar19 + *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                         field_0x5c;
  iVar1 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0xc;
  st->upload_rate =
       *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x1c +
       iVar1 + *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                        field_0x4c;
  st->download_payload_rate = iVar19;
  st->upload_payload_rate = iVar1;
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) == 0) {
    lVar22 = (this->m_tracker_timer).impl_.implementation_.expiry.__d.__r;
    lVar27 = (long)(int)tVar18.__d.__r;
    if ((SBORROW8(lVar22,lVar27 * 1000000000) != lVar22 + lVar27 * -1000000000 < 0) ||
       (lVar22 = lVar22 + lVar27 * -1000000000, (st->next_announce).__r = lVar22, lVar22 < 0))
    goto LAB_002e72d3;
  }
  else {
LAB_002e72d3:
    (st->next_announce).__r = 0;
  }
  tracker_list::last_working_url_abi_cxx11_((string *)local_50,&this->m_trackers);
  ::std::__cxx11::string::operator=((string *)&st->current_tracker,(string *)local_50);
  ::std::__cxx11::string::~string((string *)local_50);
  if ((st->current_tracker)._M_string_length == 0) {
    bVar15 = info_hash_t::has_v1(this_00);
    bVar16 = info_hash_t::has_v2(this_00);
    phVar24 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header;
    plVar30 = &phVar24->super_node;
    do {
      do {
        plVar30 = ((node *)&plVar30->next_)->next_;
        if (plVar30 == &phVar24->super_node) goto LAB_002e7320;
      } while (((ulong)plVar30[6].prev_ & 0x10000000000000) == 0);
      __it._M_current = (announce_endpoint *)plVar30[5].next_;
      paVar4 = (announce_endpoint *)plVar30[5].prev_;
      lVar22 = (long)paVar4 - (long)__it._M_current;
      local_50._0_2_ = CONCAT11(bVar16,bVar15);
      for (lVar27 = lVar22 / 200 >> 2; _Var29._M_current = __it._M_current, 0 < lVar27;
          lVar27 = lVar27 + -1) {
        bVar17 = __gnu_cxx::__ops::
                 _Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::$_0>
                 ::operator()((_Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::__0>
                               *)local_50,__it);
        if (bVar17) goto LAB_002e75bb;
        bVar17 = __gnu_cxx::__ops::
                 _Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::$_0>
                 ::operator()((_Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::__0>
                               *)local_50,__it._M_current + 1);
        _Var29._M_current = __it._M_current + 1;
        if (bVar17) goto LAB_002e75bb;
        bVar17 = __gnu_cxx::__ops::
                 _Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::$_0>
                 ::operator()((_Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::__0>
                               *)local_50,__it._M_current + 2);
        _Var29._M_current = __it._M_current + 2;
        if (bVar17) goto LAB_002e75bb;
        bVar17 = __gnu_cxx::__ops::
                 _Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::$_0>
                 ::operator()((_Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::__0>
                               *)local_50,__it._M_current + 3);
        _Var29._M_current = __it._M_current + 3;
        if (bVar17) goto LAB_002e75bb;
        __it._M_current = __it._M_current + 4;
        lVar22 = lVar22 + -800;
      }
      lVar22 = lVar22 / 200;
      if (lVar22 == 1) {
LAB_002e75d5:
        bVar17 = __gnu_cxx::__ops::
                 _Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::$_0>
                 ::operator()((_Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::__0>
                               *)local_50,__it);
        _Var29._M_current = __it._M_current;
        if (!bVar17) {
          _Var29._M_current = paVar4;
        }
      }
      else if (lVar22 == 2) {
LAB_002e75a4:
        bVar17 = __gnu_cxx::__ops::
                 _Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::$_0>
                 ::operator()((_Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::__0>
                               *)local_50,_Var29);
        if (!bVar17) {
          __it._M_current = _Var29._M_current + 1;
          goto LAB_002e75d5;
        }
      }
      else {
        if (lVar22 != 3) break;
        bVar17 = __gnu_cxx::__ops::
                 _Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::$_0>
                 ::operator()((_Iter_pred<libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::__0>
                               *)local_50,__it);
        if (!bVar17) {
          _Var29._M_current = __it._M_current + 1;
          goto LAB_002e75a4;
        }
      }
LAB_002e75bb:
    } while (_Var29._M_current != paVar4);
    ::std::__cxx11::string::_M_assign((string *)&st->current_tracker);
  }
LAB_002e7320:
  if ((flags.m_val & 0x10) != 0) {
    bitfield::operator=(&(st->verified_pieces).super_bitfield,&(this->m_verified).super_bitfield);
  }
  st->num_uploads = *(uint *)&this->field_0x5d8 & 0xffffff;
  uVar26 = (uint)*(uint3 *)&this->field_0x5d4;
  if (*(uint3 *)&this->field_0x5d4 == 0xffffff) {
    uVar26 = 0xffffffff;
  }
  st->uploads_limit = uVar26;
  iVar19 = num_peers(this);
  st->num_connections = iVar19;
  uVar26 = (uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21) &
           0xffffff;
  if (uVar26 == 0xffffff) {
    uVar26 = 0xffffffff;
  }
  st->connections_limit = uVar26;
  (st->queue_position).m_val = (this->m_sequence_number).m_val;
  st->need_save_resume = (this->m_need_save_resume_data).m_val != '\0';
  (st->need_save_resume_data).m_val = (this->m_need_save_resume_data).m_val;
  st->state = (state_t)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39)
              & checking_resume_data;
  tVar23 = torrent::flags(this);
  (st->flags).m_val = tVar23.m_val;
  peVar3 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar26 = (peVar3->m_files).m_piece_length;
  if ((int)uVar26 < 1) {
    st->state = downloading_metadata;
    st->progress_ppm = *(uint3 *)&this->field_0x604 & 0xfffff;
    st->progress = (float)(*(uint3 *)&this->field_0x604 & 0xfffff) / 1e+06;
    st->block_size = 0;
    return;
  }
  uVar28 = 0x4000;
  if (uVar26 < 0x4000) {
    uVar28 = uVar26;
  }
  st->block_size = uVar28;
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xe00000000000000) ==
      0x200000000000000) {
    st->progress_ppm = *(uint3 *)&this->field_0x604 & 0xfffff;
    uVar26 = *(uint3 *)&this->field_0x604 & 0xfffff;
  }
  else {
    if (st->total_wanted == 0) {
      st->progress_ppm = 1000000;
      fVar31 = 1.0;
      goto LAB_002e768e;
    }
    uVar26 = (uint)((st->total_wanted_done * 1000000) / st->total_wanted);
    st->progress_ppm = uVar26;
  }
  fVar31 = (float)(int)uVar26 / 1e+06;
LAB_002e768e:
  st->progress = fVar31;
  if ((flags.m_val & 8) != 0) {
    iVar19 = (peVar3->m_files).m_num_pieces;
    if ((this->super_torrent_hot_members).m_picker._M_t.
        super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
        ._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
        .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl ==
        (piece_picker *)0x0) {
      bitfield::resize(&(st->pieces).super_bitfield,iVar19,
                       (bool)((byte)((uint)*(undefined4 *)
                                            &(this->super_torrent_hot_members).field_0x48 >> 0x1e) &
                             1));
    }
    else {
      bitfield::resize(&(st->pieces).super_bitfield,iVar19,false);
      _Var5._M_head_impl =
           *(uint **)&(st->pieces).super_bitfield.m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      uVar26 = 0;
      index.m_val = 0;
      if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var5._M_head_impl !=
          (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
        uVar26 = *_Var5._M_head_impl;
        index.m_val = 0;
      }
      for (; uVar26 != index.m_val; index.m_val = index.m_val + 1) {
        bVar15 = piece_picker::has_piece_passed
                           ((this->super_torrent_hot_members).m_picker._M_t.
                            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                            _M_head_impl,index);
        if (bVar15) {
          bitfield::set_bit(&(st->pieces).super_bitfield,index.m_val);
        }
      }
    }
  }
  iVar19 = num_passed(this);
  st->num_pieces = iVar19;
  st->num_seeds = (uint)this->m_num_seeds - (uint)this->m_num_connecting_seeds;
  if (((flags.m_val & 1) == 0) ||
     (this_01._M_head_impl =
           (this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
     this_01._M_head_impl == (piece_picker *)0x0)) {
    st->distributed_full_copies = -1;
    st->distributed_fraction = -1;
    fVar31 = -1.0;
  }
  else {
    pVar25 = piece_picker::distributed_copies(this_01._M_head_impl);
    st->distributed_full_copies = pVar25.first;
    st->distributed_fraction = pVar25.second;
    fVar31 = (float)pVar25.second / 1000.0 + (float)pVar25.first;
  }
  st->distributed_copies = fVar31;
  st->last_seen_complete = this->m_swarm_last_seen_complete;
  return;
}

Assistant:

void torrent::status(torrent_status* st, status_flags_t const flags)
	{
		INVARIANT_CHECK;

		time_point32 const now = aux::time_now32();

		st->handle = get_handle();
		st->info_hashes = info_hash();
#if TORRENT_ABI_VERSION < 3
		st->info_hash = info_hash().get_best();
#endif
#if TORRENT_ABI_VERSION == 1
		st->is_loaded = true;
#endif

		if (flags & torrent_handle::query_name)
			st->name = name();

		if (flags & torrent_handle::query_save_path)
			st->save_path = save_path();

		if (flags & torrent_handle::query_torrent_file)
			st->torrent_file = m_torrent_file;

		st->has_incoming = m_has_incoming;
		st->errc = m_error;
		st->error_file = m_error_file;

#if TORRENT_ABI_VERSION == 1
		if (m_error) st->error = m_error.message()
			+ ": " + resolve_filename(m_error_file);
		st->seed_mode = m_seed_mode;
#endif
		st->moving_storage = m_moving_storage;

		st->announcing_to_trackers = m_announce_to_trackers;
		st->announcing_to_lsd = m_announce_to_lsd;
		st->announcing_to_dht = m_announce_to_dht;
#if TORRENT_ABI_VERSION == 1
		st->stop_when_ready = m_stop_when_ready;
#endif

		st->added_time = m_added_time;
		st->completed_time = m_completed_time;

#if TORRENT_ABI_VERSION == 1
		st->last_scrape = static_cast<int>(total_seconds(now - m_last_scrape));
#endif

#if TORRENT_ABI_VERSION == 1
#ifndef TORRENT_DISABLE_SHARE_MODE
		st->share_mode = m_share_mode;
#else
		st->share_mode = false;
#endif
		st->upload_mode = m_upload_mode;
#endif
		st->up_bandwidth_queue = 0;
		st->down_bandwidth_queue = 0;
#if TORRENT_ABI_VERSION == 1
		st->priority = priority();
#endif

		st->num_peers = num_peers() - m_num_connecting;

		st->list_peers = m_peer_list ? m_peer_list->num_peers() : 0;
		st->list_seeds = m_peer_list ? m_peer_list->num_seeds() : 0;
		st->connect_candidates = m_peer_list ? m_peer_list->num_connect_candidates() : 0;
		TORRENT_ASSERT(st->connect_candidates >= 0);
		st->seed_rank = seed_rank(settings());

		st->all_time_upload = m_total_uploaded;
		st->all_time_download = m_total_downloaded;

		// activity time
#if TORRENT_ABI_VERSION == 1
		st->finished_time = int(total_seconds(finished_time()));
		st->active_time = int(total_seconds(active_time()));
		st->seeding_time = int(total_seconds(seeding_time()));

		time_point32 const unset{seconds32(0)};

		st->time_since_upload = m_last_upload == unset ? -1
			: static_cast<int>(total_seconds(now - m_last_upload));
		st->time_since_download = m_last_download == unset ? -1
			: static_cast<int>(total_seconds(now - m_last_download));
#endif

		st->finished_duration = finished_time();
		st->active_duration = active_time();
		st->seeding_duration = seeding_time();

		st->last_upload = m_last_upload;
		st->last_download = m_last_download;

		st->storage_mode = static_cast<storage_mode_t>(m_storage_mode);

		st->num_complete = (m_complete == 0xffffff) ? -1 : m_complete;
		st->num_incomplete = (m_incomplete == 0xffffff) ? -1 : m_incomplete;
#if TORRENT_ABI_VERSION == 1
		st->paused = is_torrent_paused();
		st->auto_managed = m_auto_managed;
		st->sequential_download = m_sequential_download;
#endif
		st->is_seeding = is_seed();
		st->is_finished = is_finished();
#if TORRENT_ABI_VERSION == 1
#ifndef TORRENT_DISABLE_SUPERSEEDING
		st->super_seeding = m_super_seeding;
#endif
#endif
		st->has_metadata = valid_metadata();
		bytes_done(*st, flags);
		TORRENT_ASSERT(st->total_wanted_done >= 0);
		TORRENT_ASSERT(st->total_done >= st->total_wanted_done);

		// payload transfer
		st->total_payload_download = m_stat.total_payload_download();
		st->total_payload_upload = m_stat.total_payload_upload();

		// total transfer
		st->total_download = m_stat.total_payload_download()
			+ m_stat.total_protocol_download();
		st->total_upload = m_stat.total_payload_upload()
			+ m_stat.total_protocol_upload();

		// failed bytes
		st->total_failed_bytes = m_total_failed_bytes;
		st->total_redundant_bytes = m_total_redundant_bytes;

		// transfer rate
		st->download_rate = m_stat.download_rate();
		st->upload_rate = m_stat.upload_rate();
		st->download_payload_rate = m_stat.download_payload_rate();
		st->upload_payload_rate = m_stat.upload_payload_rate();

		if (is_paused() || m_tracker_timer.expiry() < now)
			st->next_announce = seconds(0);
		else
			st->next_announce = m_tracker_timer.expiry() - now;

		if (st->next_announce.count() < 0)
			st->next_announce = seconds(0);

#if TORRENT_ABI_VERSION == 1
		st->announce_interval = seconds(0);
#endif

		st->current_tracker = m_trackers.last_working_url();
		if (st->current_tracker.empty())
		{
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
			aux::array<bool const, num_protocols, protocol_version> const supports_protocol{
			{
				m_info_hash.has_v1(),
				m_info_hash.has_v2()
			}};
#ifdef __clang__
#pragma clang diagnostic pop
#endif

			for (auto const& t : m_trackers)
			{
				if (!t.verified) continue;
				if (std::any_of(t.endpoints.begin(), t.endpoints.end()
					, [supports_protocol](aux::announce_endpoint const& aep) {
						for (protocol_version const ih : all_versions)
						{
							if (supports_protocol[ih] && aep.info_hashes[ih].updating)
								return false;
						}
						return true;
					})) continue;
				st->current_tracker = t.url;
				break;
			}
		}

		if ((flags & torrent_handle::query_verified_pieces))
		{
			st->verified_pieces = m_verified;
		}

		st->num_uploads = m_num_uploads;
		st->uploads_limit = m_max_uploads == (1 << 24) - 1 ? -1 : m_max_uploads;
		st->num_connections = num_peers();
		st->connections_limit = m_max_connections == (1 << 24) - 1 ? -1 : m_max_connections;
		// if we don't have any metadata, stop here

		st->queue_position = queue_position();
#if TORRENT_ABI_VERSION < 4
		st->need_save_resume = bool(m_need_save_resume_data);
#endif
		st->need_save_resume_data = m_need_save_resume_data;
#if TORRENT_ABI_VERSION == 1
		st->ip_filter_applies = m_apply_ip_filter;
#endif

		st->state = static_cast<torrent_status::state_t>(m_state);
		st->flags = this->flags();

#if TORRENT_USE_ASSERTS
		if (st->state == torrent_status::finished
			|| st->state == torrent_status::seeding)
		{
			// it may be tempting to assume that st->is_finished == true here, but
			// this assumption does not always hold. We transition to "finished"
			// when we receive the last block of the last piece, which is before
			// the hash check comes back. "is_finished" is set to true once all the
			// pieces have been hash checked. So, there's a short window where it
			// doesn't hold.
		}
#endif

		if (!valid_metadata())
		{
			st->state = torrent_status::downloading_metadata;
			st->progress_ppm = m_progress_ppm;
#if !TORRENT_NO_FPU
			st->progress = m_progress_ppm / 1000000.f;
#endif
			st->block_size = 0;
			return;
		}

		st->block_size = block_size();

		if (m_state == torrent_status::checking_files)
		{
			st->progress_ppm = m_progress_ppm;
#if !TORRENT_NO_FPU
			st->progress = m_progress_ppm / 1000000.f;
#endif
		}
		else if (st->total_wanted == 0)
		{
			st->progress_ppm = 1000000;
			st->progress = 1.f;
		}
		else
		{
			st->progress_ppm = int(st->total_wanted_done * 1000000
				/ st->total_wanted);
#if !TORRENT_NO_FPU
			st->progress = float(st->progress_ppm) / 1000000.f;
#endif
		}

		if (flags & torrent_handle::query_pieces)
		{
			int const num_pieces = m_torrent_file->num_pieces();
			if (has_picker())
			{
				st->pieces.resize(num_pieces, false);
				for (auto const i : st->pieces.range())
					if (m_picker->has_piece_passed(i)) st->pieces.set_bit(i);
			}
			else if (m_have_all)
			{
				st->pieces.resize(num_pieces, true);
			}
			else
			{
				st->pieces.resize(num_pieces, false);
			}
		}
		st->num_pieces = num_passed();
#if TORRENT_USE_INVARIANT_CHECKS
		{
			// The documentation states that `num_pieces` is the count of number
			// of bits set in `pieces`. Ensure that invariant holds.
			int num_have_pieces = 0;
			if (has_picker())
			{
				for (auto const i : m_torrent_file->piece_range())
					if (m_picker->has_piece_passed(i)) ++num_have_pieces;
			}
			else if (m_have_all)
			{
				num_have_pieces = m_torrent_file->num_pieces();
			}
			TORRENT_ASSERT(num_have_pieces == st->num_pieces);
		}
#endif
		st->num_seeds = num_seeds();
		if ((flags & torrent_handle::query_distributed_copies) && m_picker.get())
		{
			std::tie(st->distributed_full_copies, st->distributed_fraction) =
				m_picker->distributed_copies();
#if TORRENT_NO_FPU
			st->distributed_copies = -1.f;
#else
			st->distributed_copies = float(st->distributed_full_copies)
				+ float(st->distributed_fraction) / 1000;
#endif
		}
		else
		{
			st->distributed_full_copies = -1;
			st->distributed_fraction = -1;
			st->distributed_copies = -1.f;
		}

		st->last_seen_complete = m_swarm_last_seen_complete;
	}